

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> __thiscall
pbrt::MIPMap::CreateFromFile
          (MIPMap *this,string *filename,MIPMapFilterOptions *options,WrapMode wrapMode,
          ColorEncodingHandle *encoding,Allocator alloc)

{
  long lVar1;
  float *pfVar2;
  bool bVar3;
  _Alloc_hider _Var5;
  long lVar6;
  _Alloc_hider _Var7;
  long lVar8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  RGBColorSpace *colorSpace;
  ImageChannelDesc rgbDesc;
  ImageChannelDesc rgbaDesc;
  ImageAndMetadata imageAndMetadata;
  MIPMapFilterOptions local_3f0;
  _Head_base<0UL,_pbrt::MIPMap_*,_false> local_3e8;
  MIPMapFilterOptions *local_3e0;
  float local_3d8;
  undefined1 local_3d4 [4];
  undefined1 local_3d0 [32];
  undefined1 local_3b0 [32];
  long local_390 [2];
  long local_380 [2];
  string local_370 [16];
  long local_360 [8];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_320;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_318;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_2f8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_2d8;
  long local_2b8;
  ImageChannelDesc local_2b0;
  ImageChannelDesc local_280;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_250;
  ImageAndMetadata local_248;
  bool bVar4;
  
  local_250.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  local_3f0 = (MIPMapFilterOptions)alloc.memoryResource;
  local_3d4 = (undefined1  [4])wrapMode;
  Image::Read(&local_248,filename,alloc,(ColorEncodingHandle *)&local_250);
  if ((int)local_248.image.channelNames.nStored == 1) goto LAB_003ba8d3;
  local_3d0._0_8_ = local_3d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"R","");
  local_3e0 = options;
  local_3b0._0_8_ = local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"G","");
  _Var5._M_p = (pointer)local_380;
  local_3e8._M_head_impl = this;
  local_390[0] = (long)_Var5._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"B","");
  _Var7._M_p = (pointer)local_360;
  local_370._0_8_ = _Var7._M_p;
  std::__cxx11::string::_M_construct<char_const*>(local_370,"A","");
  requestedChannels.n = 4;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0;
  Image::GetChannelDesc(&local_280,&local_248.image,requestedChannels);
  lVar6 = -0x80;
  do {
    if ((long *)_Var7._M_p != *(long **)((long)_Var7._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var7._M_p + -0x10),*(long *)_Var7._M_p + 1);
    }
    _Var7._M_p = _Var7._M_p + -0x20;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  local_3d0._0_8_ = local_3d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"R","");
  local_3b0._0_8_ = local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"G","");
  local_390[0] = (long)_Var5._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"B","");
  requestedChannels_00.n = 3;
  requestedChannels_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0;
  Image::GetChannelDesc(&local_2b0,&local_248.image,requestedChannels_00);
  lVar6 = -0x60;
  do {
    if ((long *)_Var5._M_p != *(long **)((long)_Var5._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var5._M_p + -0x10),*(long *)_Var5._M_p + 1);
    }
    _Var5._M_p = _Var5._M_p + -0x20;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if (local_280.offset.nStored == 0) {
    if (local_2b0.offset.nStored == 0) {
      ErrorExit<std::__cxx11::string_const&>
                ("%s: image doesn\'t have R, G, and B channels",filename);
    }
    Image::SelectChannels((Image *)local_3d0,&local_248.image,&local_2b0,(Allocator)local_3f0);
    local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_3d0._8_4_;
    local_248.image.format = local_3d0._0_4_;
    local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_3d0._4_4_;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_248.image.channelNames,
                (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3d0 + 0x10));
    local_248.image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_320.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&local_248.image.p8,&local_318);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&local_248.image.p16,&local_2f8);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&local_248.image.p32,&local_2d8);
    local_2d8.nStored = 0;
    (*(local_2d8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_2d8.alloc.memoryResource,local_2d8.ptr,local_2d8.nAlloc << 2,4);
    local_2f8.nStored = 0;
    (*(local_2f8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_2f8.alloc.memoryResource,local_2f8.ptr,local_2f8.nAlloc * 2,2);
    this = local_3e8._M_head_impl;
    local_318.nStored = 0;
    (*(local_318.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_318.alloc.memoryResource,local_318.ptr,local_318.nAlloc,1);
  }
  else {
    if (0 < local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.y) {
      bVar4 = true;
      bVar3 = true;
      lVar8 = 0;
      lVar6 = 0;
      do {
        local_2b8 = lVar6;
        if (0 < local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.x) {
          lVar6 = 0;
          bVar3 = bVar4;
          do {
            Image::GetChannels((ImageChannelValues *)local_3d0,&local_248.image,
                               (Point2i)(lVar8 + lVar6),&local_280,(WrapMode2D)0x200000002);
            lVar1 = CONCAT44(local_3d0._12_4_,local_3d0._8_4_);
            pfVar2 = (float *)(lVar1 + 0xc);
            if (lVar1 == 0) {
              pfVar2 = (float *)(local_3d0 + 0x1c);
            }
            local_3d8 = *pfVar2;
            local_3b0._8_8_ = 0;
            (**(code **)(*(long *)local_3d0._0_8_ + 0x18))
                      (local_3d0._0_8_,lVar1,local_3b0._0_8_ << 2,4);
            if (local_3d8 != 1.0) {
              bVar3 = false;
            }
            if (NAN(local_3d8)) {
              bVar3 = false;
            }
            lVar6 = lVar6 + 1;
            bVar4 = bVar3;
          } while (lVar6 < local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
        }
        lVar6 = local_2b8 + 1;
        lVar8 = lVar8 + 0x100000000;
      } while (lVar6 < local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
      if (!bVar3) {
        Image::SelectChannels((Image *)local_3d0,&local_248.image,&local_280,(Allocator)local_3f0);
        local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_3d0._8_4_;
        local_248.image.format = local_3d0._0_4_;
        local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_3d0._4_4_;
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_248.image.channelNames,
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_3d0 + 0x10));
        local_248.image.encoding.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )local_320.bits;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  (&local_248.image.p8,&local_318);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  (&local_248.image.p16,&local_2f8);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_248.image.p32,&local_2d8);
        local_2d8.nStored = 0;
        (*(local_2d8.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_2d8.alloc.memoryResource,local_2d8.ptr,local_2d8.nAlloc << 2,4);
        local_2f8.nStored = 0;
        (*(local_2f8.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_2f8.alloc.memoryResource,local_2f8.ptr,local_2f8.nAlloc * 2,2);
        this = local_3e8._M_head_impl;
        local_318.nStored = 0;
        (*(local_318.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_318.alloc.memoryResource,local_318.ptr,local_318.nAlloc,1);
        goto LAB_003ba865;
      }
    }
    Image::SelectChannels((Image *)local_3d0,&local_248.image,&local_2b0,(Allocator)local_3f0);
    local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_3d0._8_4_;
    local_248.image.format = local_3d0._0_4_;
    local_248.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_3d0._4_4_;
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_248.image.channelNames,
                (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3d0 + 0x10));
    local_248.image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_320.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&local_248.image.p8,&local_318);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&local_248.image.p16,&local_2f8);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&local_248.image.p32,&local_2d8);
    local_2d8.nStored = 0;
    (*(local_2d8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_2d8.alloc.memoryResource,local_2d8.ptr,local_2d8.nAlloc << 2,4);
    local_2f8.nStored = 0;
    (*(local_2f8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_2f8.alloc.memoryResource,local_2f8.ptr,local_2f8.nAlloc * 2,2);
    this = local_3e8._M_head_impl;
    local_318.nStored = 0;
    (*(local_318.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_318.alloc.memoryResource,local_318.ptr,local_318.nAlloc,1);
  }
LAB_003ba865:
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_3d0 + 0x10));
  local_2b0.offset.nStored = 0;
  (*(local_2b0.offset.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_2b0.offset.alloc.memoryResource,local_2b0.offset.ptr,local_2b0.offset.nAlloc << 2
             ,4);
  local_280.offset.nStored = 0;
  (*(local_280.offset.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_280.offset.alloc.memoryResource,local_280.offset.ptr,local_280.offset.nAlloc << 2
             ,4);
LAB_003ba8d3:
  local_3d0._0_8_ = ImageMetadata::GetColorSpace(&local_248.metadata);
  std::
  make_unique<pbrt::MIPMap,pbrt::Image,pbrt::RGBColorSpace_const*&,pbrt::WrapMode&,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::MIPMapFilterOptions_const&>
            ((Image *)this,(RGBColorSpace **)&local_248,(WrapMode *)local_3d0,
             (polymorphic_allocator<std::byte> *)local_3d4,&local_3f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_248.metadata.stringVectors._M_t);
  if (local_248.metadata.colorSpace.set == true) {
    local_248.metadata.colorSpace.set = false;
  }
  if (local_248.metadata.MSE.set == true) {
    local_248.metadata.MSE.set = false;
  }
  if (local_248.metadata.samplesPerPixel.set == true) {
    local_248.metadata.samplesPerPixel.set = false;
  }
  if (local_248.metadata.fullResolution.set == true) {
    local_248.metadata.fullResolution.set = false;
  }
  if (local_248.metadata.pixelBounds.set == true) {
    local_248.metadata.pixelBounds.set = false;
  }
  if (local_248.metadata.NDCFromWorld.set == true) {
    local_248.metadata.NDCFromWorld.set = false;
  }
  if (local_248.metadata.cameraFromWorld.set == true) {
    local_248.metadata.cameraFromWorld.set = false;
  }
  if (local_248.metadata.renderTimeSeconds.set == true) {
    local_248.metadata.renderTimeSeconds.set = false;
  }
  local_248.image.p32.nStored = 0;
  (*(local_248.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_248.image.p32.alloc.memoryResource,local_248.image.p32.ptr,
             local_248.image.p32.nAlloc << 2,4);
  local_248.image.p16.nStored = 0;
  (*(local_248.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_248.image.p16.alloc.memoryResource,local_248.image.p16.ptr,
             local_248.image.p16.nAlloc * 2,2);
  local_248.image.p8.nStored = 0;
  (*(local_248.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_248.image.p8.alloc.memoryResource,local_248.image.p8.ptr,
             local_248.image.p8.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_248.image.channelNames);
  return (__uniq_ptr_data<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>,_true,_true>)
         (tuple<pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>)this;
}

Assistant:

std::unique_ptr<MIPMap> MIPMap::CreateFromFile(const std::string &filename,
                                               const MIPMapFilterOptions &options,
                                               WrapMode wrapMode,
                                               ColorEncodingHandle encoding,
                                               Allocator alloc) {
    ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc, encoding);

    Image &image = imageAndMetadata.image;
    if (image.NChannels() != 1) {
        // Get the channels in a canonical order..
        ImageChannelDesc rgbaDesc = image.GetChannelDesc({"R", "G", "B", "A"});
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (rgbaDesc) {
            // Is alpha all ones?
            bool allOne = true;
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    if (image.GetChannels({x, y}, rgbaDesc)[3] != 1)
                        allOne = false;
            if (allOne)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                image = image.SelectChannels(rgbaDesc, alloc);
        } else {
            if (rgbDesc)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                ErrorExit("%s: image doesn't have R, G, and B channels", filename);
        }
    }

    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();
    return std::make_unique<MIPMap>(std::move(image), colorSpace, wrapMode, alloc,
                                    options);
}